

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_Proto3ExtensionPresence_Test::TestBody
          (FeaturesTest_Proto3ExtensionPresence_Test *this)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  Nonnull<const_char_*> pcVar3;
  undefined8 extraout_RAX;
  char *in_R9;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *unaff_R14;
  pointer *__ptr;
  string_view file_text;
  Metadata MVar4;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  MVar4 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar4.descriptor)->file_);
  file_text._M_str =
       "\n    name: \"foo.proto\"\n    syntax: \"proto3\"\n    dependency: \"google/protobuf/descriptor.proto\"\n    extension {\n      name: \"singular_ext\"\n      number: 1001\n      label: LABEL_OPTIONAL\n      type: TYPE_STRING\n      extendee: \".google.protobuf.FileOptions\"\n    }\n    extension {\n      name: \"singular_proto3_optional_ext\"\n      number: 1002\n      label: LABEL_OPTIONAL\n      type: TYPE_STRING\n      extendee: \".google.protobuf.FileOptions\"\n      proto3_optional: true\n    }\n    extension {\n      name: \"repeated_ext\"\n      number: 1003\n      label: LABEL_REPEATED\n      type: TYPE_STRING\n      extendee: \".google.protobuf.FileOptions\"\n    }\n  "
  ;
  file_text._M_len = 0x282;
  pFVar2 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,file_text);
  if ((long)pFVar2->extension_count_ < 1) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)pFVar2->extension_count_,"index < extension_count()");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    local_40[0] = (internal)FieldDescriptor::has_presence(pFVar2->extensions_);
    unaff_R14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_38;
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_40[0]) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_30,local_40,(AssertionResult *)"file->extension(0)->has_presence()","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x2163,local_30._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      if (local_50._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_50._M_head_impl + 8))();
      }
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(unaff_R14,local_38);
    }
    if ((long)pFVar2->extension_count_ < 2) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (1,(long)pFVar2->extension_count_,"index < extension_count()");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      local_40[0] = (internal)FieldDescriptor::has_presence(pFVar2->extensions_ + 1);
      unaff_R14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_38;
      local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_40[0]) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_30,local_40,(AssertionResult *)"file->extension(1)->has_presence()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x2164,local_30._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != &local_30.field_2) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
        if (local_50._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_50._M_head_impl + 8))();
        }
      }
      if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(unaff_R14,local_38);
      }
      if ((long)pFVar2->extension_count_ < 3) {
        pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (2,(long)pFVar2->extension_count_,"index < extension_count()");
      }
      else {
        pcVar3 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar3 == (Nonnull<const_char_*>)0x0) {
        bVar1 = FieldDescriptor::has_presence(pFVar2->extensions_ + 2);
        local_40[0] = (internal)!bVar1;
        local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_40[0]) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,local_40,(AssertionResult *)"file->extension(2)->has_presence()",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2165,local_30._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_30._M_dataplus._M_p != &local_30.field_2) {
            operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
          }
          if (local_50._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_50._M_head_impl + 8))();
          }
        }
        if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_38,local_38);
        }
        return;
      }
      goto LAB_005a5f76;
    }
  }
  else {
    TestBody();
  }
  TestBody();
LAB_005a5f76:
  TestBody();
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_50._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(unaff_R14,local_38);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST_F(FeaturesTest, Proto3ExtensionPresence) {
  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "proto3"
    dependency: "google/protobuf/descriptor.proto"
    extension {
      name: "singular_ext"
      number: 1001
      label: LABEL_OPTIONAL
      type: TYPE_STRING
      extendee: ".google.protobuf.FileOptions"
    }
    extension {
      name: "singular_proto3_optional_ext"
      number: 1002
      label: LABEL_OPTIONAL
      type: TYPE_STRING
      extendee: ".google.protobuf.FileOptions"
      proto3_optional: true
    }
    extension {
      name: "repeated_ext"
      number: 1003
      label: LABEL_REPEATED
      type: TYPE_STRING
      extendee: ".google.protobuf.FileOptions"
    }
  )pb");

  EXPECT_TRUE(file->extension(0)->has_presence());
  EXPECT_TRUE(file->extension(1)->has_presence());
  EXPECT_FALSE(file->extension(2)->has_presence());
}